

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlXPathNodeSetAddNs(void)

{
  int iVar1;
  int iVar2;
  xmlNodeSetPtr val;
  xmlNodePtr val_00;
  xmlNsPtr val_01;
  int local_44;
  int n_ns;
  xmlNsPtr ns;
  int n_node;
  xmlNodePtr node;
  int n_cur;
  xmlNodeSetPtr cur;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (node._4_4_ = 0; (int)node._4_4_ < 1; node._4_4_ = node._4_4_ + 1) {
    for (ns._4_4_ = 0; (int)ns._4_4_ < 3; ns._4_4_ = ns._4_4_ + 1) {
      for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlNodeSetPtr(node._4_4_,0);
        val_00 = gen_xmlNodePtr(ns._4_4_,1);
        val_01 = gen_xmlNsPtr(local_44,2);
        iVar2 = xmlXPathNodeSetAddNs(val,val_00,val_01);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_xmlNodeSetPtr(node._4_4_,val,0);
        des_xmlNodePtr(ns._4_4_,val_00,1);
        des_xmlNsPtr(local_44,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathNodeSetAddNs",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)node._4_4_);
          printf(" %d",(ulong)ns._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlXPathNodeSetAddNs(void) {
    int test_ret = 0;

#if defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    int ret_val;
    xmlNodeSetPtr cur; /* the initial node set */
    int n_cur;
    xmlNodePtr node; /* the hosting node */
    int n_node;
    xmlNsPtr ns; /* a the namespace node */
    int n_ns;

    for (n_cur = 0;n_cur < gen_nb_xmlNodeSetPtr;n_cur++) {
    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
    for (n_ns = 0;n_ns < gen_nb_xmlNsPtr;n_ns++) {
        mem_base = xmlMemBlocks();
        cur = gen_xmlNodeSetPtr(n_cur, 0);
        node = gen_xmlNodePtr(n_node, 1);
        ns = gen_xmlNsPtr(n_ns, 2);

        ret_val = xmlXPathNodeSetAddNs(cur, node, ns);
        desret_int(ret_val);
        call_tests++;
        des_xmlNodeSetPtr(n_cur, cur, 0);
        des_xmlNodePtr(n_node, node, 1);
        des_xmlNsPtr(n_ns, ns, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlXPathNodeSetAddNs",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_cur);
            printf(" %d", n_node);
            printf(" %d", n_ns);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}